

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O0

void __thiscall di::Context::addClassAuto<T6>(Context *this,...)

{
  runtime_error *this_00;
  allocator local_71;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  Context *local_10;
  Context *this_local;
  
  local_10 = this;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Class \'",&local_71);
  std::type_info::name((type_info *)&T6::typeinfo);
  std::operator+(local_50,(char *)local_70);
  std::operator+(local_30,(char *)local_50);
  std::runtime_error::runtime_error(this_00,(string *)local_30);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void addClassAuto(...)
    {
        throw std::runtime_error(std::string("Class '") + typeid(T).name() + "' has no factory in context!");
    }